

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O1

float_t __thiscall djb::tab::qf2(tab *this,float_t u,float_t qf1,vec3 *wi)

{
  vec2 vVar1;
  uint uVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  vec2 local_60;
  undefined1 local_58 [16];
  float_t local_48;
  float local_38;
  float_t fStack_34;
  float_t fStack_30;
  float_t fStack_2c;
  
  fVar5 = 0.0;
  if (0.0 <= u) {
    fVar5 = u;
  }
  local_58._0_4_ = 1.0;
  fVar4 = 1.0;
  if (fVar5 <= 1.0) {
    fVar4 = fVar5;
  }
  if ((fVar4 < 1.0) && ((1.0 < fVar5 || (local_58._0_4_ = 0.0, 0.0001 < ABS(u) && 0.0 <= u)))) {
    local_58._0_4_ = 0.0;
    uVar2 = 0;
    local_48 = u;
    do {
      local_58 = ZEXT416((uint)((float)(int)((uint)(0.0 < fVar4) - (uint)(fVar4 < 0.0)) /
                                (float)(2 << ((byte)uVar2 & 0x1f)) + (float)local_58._0_4_));
      local_60.y = 1.0;
      local_60.x = qf1;
      vVar1 = cdfv(this,&local_60,wi);
      local_38 = vVar1.y;
      local_60.y = (float_t)local_58._0_4_;
      local_60.x = qf1;
      fStack_34 = local_38;
      fStack_30 = local_38;
      fStack_2c = local_38;
      vVar1 = cdfv(this,&local_60,wi);
      fVar4 = local_48 - vVar1.y / local_38;
      if (ABS(fVar4) <= 0.0001) {
        return (float_t)local_58._0_4_;
      }
      bVar3 = uVar2 < 0x1d;
      uVar2 = uVar2 + 1;
    } while (bVar3);
  }
  return (float_t)local_58._0_4_;
}

Assistant:

float_t tab::qf2(float_t u, float_t qf1, const vec3 &wi) const
{
	const float_t epsilon = 1e-4;
	float_t u2 = 0, delta = sat(u);
	int32_t level = 0;

	if (delta >= 1) return 1;

	while (fabs(delta) > epsilon && level < 30) {
		u2+= (float_t)sgn(delta) / (2 << level);
		delta = u - cdf2(u2, qf1, wi);
		++level;
	}

	return u2;
}